

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseImportModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  TokenType TVar2;
  Result RVar3;
  pointer *__ptr;
  long *plVar4;
  long lVar5;
  string name;
  Location loc;
  string field_name;
  string module_name;
  undefined1 local_128 [8];
  undefined1 local_120 [32];
  long *local_100 [2];
  long local_f0 [2];
  undefined1 local_e0 [4];
  Enum local_dc;
  string local_d8;
  long *local_b8;
  size_type sStack_b0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_a8;
  long lStack_a0;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_90;
  string local_88;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_120,this);
  local_a8.offset = local_120._16_8_;
  lStack_a0 = local_120._24_8_;
  local_b8 = (long *)local_120._0_8_;
  sStack_b0 = local_120._8_8_;
  CheckImportOrdering(this,module);
  RVar1 = Expect(this,Import);
  RVar3.enum_ = Error;
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  RVar1 = ParseQuotedText(this,&local_68,true);
  if (RVar1.enum_ == Error) goto LAB_0019561e;
  RVar3.enum_ = Error;
  RVar1 = ParseQuotedText(this,&local_88,true);
  if ((RVar1.enum_ == Error) || (RVar1 = Expect(this,Lpar), RVar1.enum_ == Error))
  goto LAB_0019561e;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  TVar2 = Peek(this,0);
  if ((int)TVar2 < 0x1c) {
    if (TVar2 == Tag) {
      Consume((Token *)local_120,this);
      ParseBindVarOpt(this,&local_d8);
      std::make_unique<wabt::TagImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      RVar1 = ParseTypeUseOpt(this,(FuncDeclaration *)(local_120._0_8_ + 0x70));
      if (RVar1.enum_ != Error) {
        RVar1 = ParseUnboundFuncSignature(this,(FuncSignature *)(local_120._0_8_ + 0xc0));
        goto LAB_0019548e;
      }
      goto LAB_001954a9;
    }
    if (TVar2 == Global) {
      Consume((Token *)local_120,this);
      ParseBindVarOpt(this,&local_d8);
      std::make_unique<wabt::GlobalImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      RVar1 = ParseGlobalType(this,(Global *)(local_120._0_8_ + 0x50));
LAB_00195405:
      local_128 = (undefined1  [8])local_120._0_8_;
      if ((RVar1.enum_ == Error) ||
         (RVar1 = Expect(this,Rpar), local_128 = (undefined1  [8])local_120._0_8_,
         RVar1.enum_ == Error)) goto LAB_00195425;
LAB_00195551:
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           operator_new(0x48);
      local_128 = (undefined1  [8])local_120._0_8_;
LAB_00195563:
      *(long *)((long)&((ImportModuleField *)
                       local_90._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                       super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 8) = 0;
      *(long *)((long)&((ImportModuleField *)
                       local_90._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                       super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x10) = 0;
      *(size_t *)
       ((long)&((ImportModuleField *)
               local_90._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x28) = local_a8.offset;
      *(long *)((long)&((ImportModuleField *)
                       local_90._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                       super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x30) = lStack_a0;
      *(long **)((long)&((ImportModuleField *)
                        local_90._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                        super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x18) = local_b8;
      *(size_type *)
       ((long)&((ImportModuleField *)
               local_90._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x20) = sStack_b0;
      *(undefined4 *)
       ((long)&((ImportModuleField *)
               local_90._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x38) = 2;
      *(undefined ***)
       &((ImportModuleField *)
        local_90._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
        super_ModuleFieldMixin<(wabt::ModuleFieldType)2> = &PTR__ImportModuleField_00241be0;
      ((ImportModuleField *)
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->import =
           (unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>)local_128;
      std::__cxx11::string::_M_assign((string *)((long)local_128 + 8));
      std::__cxx11::string::_M_assign
                ((string *)
                 (*(long *)&((ImportModuleField *)
                            local_90._M_t.
                            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                            import + 0x28));
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_90);
      if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           )local_90._M_t.
            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
          (ImportModuleField *)0x0) {
        (**(code **)(*(long *)local_90._M_t.
                              super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                              .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl
                    + 8))();
      }
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            )0x0;
      RVar1 = Expect(this,Rpar);
      RVar3.enum_ = (Enum)(RVar1.enum_ == Error);
    }
    else {
LAB_001954c8:
      local_120._0_8_ = local_120 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"an external kind","");
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 (string *)local_120);
      RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_48,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
    }
  }
  else if (TVar2 == Memory) {
    Consume((Token *)local_120,this);
    ParseBindVarOpt(this,&local_d8);
    std::make_unique<wabt::MemoryImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    RVar1 = ParseLimitsIndex(this,(Limits *)(local_120._0_8_ + 0x70));
    if (RVar1.enum_ != Error) {
      RVar1 = ParseLimits(this,(Limits *)(local_120._0_8_ + 0x70));
LAB_0019548e:
      if ((RVar1.enum_ != Error) && (RVar1 = Expect(this,Rpar), RVar1.enum_ != Error))
      goto LAB_00195551;
    }
LAB_001954a9:
    if ((long *)local_120._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_120._0_8_ + 8))();
    }
    RVar3.enum_ = Error;
  }
  else {
    if (TVar2 == Table) {
      Consume((Token *)local_120,this);
      ParseBindVarOpt(this,&local_d8);
      std::make_unique<wabt::TableImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      RVar1 = ParseLimits(this,(Limits *)(local_120._0_8_ + 0x70));
      local_128 = (undefined1  [8])local_120._0_8_;
      if (RVar1.enum_ != Error) {
        RVar1 = ParseRefType(this,(Type *)(local_120._0_8_ + 0x88));
        goto LAB_00195405;
      }
    }
    else {
      if (TVar2 != First_RefKind) goto LAB_001954c8;
      Consume((Token *)local_120,this);
      ParseBindVarOpt(this,&local_d8);
      std::make_unique<wabt::FuncImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
      RVar1 = ParseTypeUseOpt(this,(FuncDeclaration *)((long)local_128 + 0x70));
      if ((RVar1.enum_ != Error) &&
         (RVar1 = ParseFuncSignature(this,(FuncSignature *)((long)local_128 + 0xc0),
                                     (BindingHash *)((long)local_128 + 0x178)), RVar1.enum_ != Error
         )) {
        local_120._0_8_ = local_120 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"param","");
        plVar4 = local_f0;
        local_100[0] = plVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"result","");
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   local_120,local_e0);
        local_dc = (Enum)ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&local_48,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_48);
        lVar5 = -0x40;
        do {
          if (plVar4 != (long *)plVar4[-2]) {
            operator_delete((long *)plVar4[-2],*plVar4 + 1);
          }
          plVar4 = plVar4 + -4;
          lVar5 = lVar5 + 0x20;
        } while (lVar5 != 0);
        if ((local_dc != Error) && (RVar1 = Expect(this,Rpar), RVar1.enum_ != Error)) {
          local_90._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
               (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
               operator_new(0x48);
          goto LAB_00195563;
        }
      }
    }
LAB_00195425:
    if (local_128 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_128 + 8))();
    }
    RVar3.enum_ = Error;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
LAB_0019561e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result WastParser::ParseImportModuleField(Module* module) {
  WABT_TRACE(ParseImportModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  CheckImportOrdering(module);
  EXPECT(Import);
  std::string module_name;
  std::string field_name;
  CHECK_RESULT(ParseQuotedText(&module_name));
  CHECK_RESULT(ParseQuotedText(&field_name));
  EXPECT(Lpar);

  std::unique_ptr<ImportModuleField> field;
  std::string name;

  switch (Peek()) {
    case TokenType::Func: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<FuncImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->func.decl));
      CHECK_RESULT(
          ParseFuncSignature(&import->func.decl.sig, &import->func.bindings));
      CHECK_RESULT(ErrorIfLpar({"param", "result"}));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Table: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<TableImport>(name);
      CHECK_RESULT(ParseLimits(&import->table.elem_limits));
      CHECK_RESULT(ParseRefType(&import->table.elem_type));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Memory: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<MemoryImport>(name);
      CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
      CHECK_RESULT(ParseLimits(&import->memory.page_limits));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Global: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<GlobalImport>(name);
      CHECK_RESULT(ParseGlobalType(&import->global));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Tag: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<TagImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->tag.decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&import->tag.decl.sig));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    default:
      return ErrorExpected({"an external kind"});
  }

  field->import->module_name = module_name;
  field->import->field_name = field_name;

  module->AppendField(std::move(field));
  EXPECT(Rpar);
  return Result::Ok;
}